

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cylinder.cpp
# Opt level: O3

Tuple4d * __thiscall
geometry::primitive::Cylinder::local_normal
          (Tuple4d *__return_storage_ptr__,Cylinder *this,Tuple4d *point,Intersection *hit)

{
  double *pdVar1;
  double dVar2;
  double y;
  double z;
  
  pdVar1 = math::Tuple4d::operator()(point,0);
  dVar2 = *pdVar1;
  pdVar1 = math::Tuple4d::operator()(point,2);
  if ((this->m_closed != true) || (1.0 <= *pdVar1 * *pdVar1 + dVar2 * dVar2 + 1e-05)) {
    pdVar1 = math::Tuple4d::operator()(point,0);
    dVar2 = *pdVar1;
    pdVar1 = math::Tuple4d::operator()(point,2);
    z = *pdVar1;
    y = 0.0;
  }
  else {
    pdVar1 = math::Tuple4d::operator()(point,1);
    if (this->m_minmax[1] + -1e-05 <= *pdVar1) {
      y = 1.0;
    }
    else {
      y = -1.0;
    }
    dVar2 = 0.0;
    z = 0.0;
  }
  math::vector(dVar2,y,z);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cylinder::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double distance = pow(point(0), 2) + pow(point(2), 2);
    if (m_closed && distance + constants::EPSILON < 1)
    {
	if (point(1) >= (m_minmax[1] - constants::EPSILON))
	    return math::vector(0, 1, 0);
	else
	    return math::vector(0, -1, 0);
    }
    return math::vector(point(0), 0, point(2));
}